

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall
re2c::OutputFile::emit
          (OutputFile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types,size_t max_fill)

{
  value_type this_00;
  uint32_t uVar1;
  size_type sVar2;
  reference ppOVar3;
  reference ppOVar4;
  void *__ptr;
  size_t __n;
  string local_60 [8];
  string content;
  OutputFragment *f;
  uint i;
  OutputBlock *b;
  uint j;
  uint line_count;
  size_t max_fill_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *types_local;
  OutputFile *this_local;
  
  if (this->file != (FILE *)0x0) {
    b._4_4_ = 1;
    for (b._0_4_ = 0;
        sVar2 = std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::size
                          (&this->blocks), (uint)b < sVar2; b._0_4_ = (uint)b + 1) {
      ppOVar3 = std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::operator[]
                          (&this->blocks,(ulong)(uint)b);
      this_00 = *ppOVar3;
      for (f._4_4_ = 0;
          sVar2 = std::vector<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>::size
                            (&this_00->fragments), f._4_4_ < sVar2; f._4_4_ = f._4_4_ + 1) {
        ppOVar4 = std::vector<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>::
                  operator[](&this_00->fragments,(ulong)f._4_4_);
        content.field_2._8_8_ = *ppOVar4;
        switch(((value_type)content.field_2._8_8_)->type) {
        case CODE:
          break;
        case LINE_INFO:
          output_line_info((ostream *)&((value_type)content.field_2._8_8_)->stream,b._4_4_ + 1,
                           this->file_name);
          break;
        case STATE_GOTO:
          output_state_goto((ostream *)&((value_type)content.field_2._8_8_)->stream,
                            ((value_type)content.field_2._8_8_)->indent,0);
          break;
        case TYPES:
          output_types((ostream *)&((value_type)content.field_2._8_8_)->stream,
                       ((value_type)content.field_2._8_8_)->indent,types);
          break;
        case WARN_CONDITION_ORDER:
          if ((this->warn_condition_order & 1U) != 0) {
            Warn::condition_order((Warn *)warn,this_00->line);
          }
          break;
        case YYACCEPT_INIT:
          output_yyaccept_init
                    ((ostream *)&((value_type)content.field_2._8_8_)->stream,
                     ((value_type)content.field_2._8_8_)->indent,(bool)(this_00->used_yyaccept & 1))
          ;
          break;
        case YYMAXFILL:
          output_yymaxfill((ostream *)&((value_type)content.field_2._8_8_)->stream,max_fill);
        }
        std::__cxx11::ostringstream::str();
        __ptr = (void *)std::__cxx11::string::c_str();
        __n = std::__cxx11::string::size();
        fwrite(__ptr,1,__n,(FILE *)this->file);
        uVar1 = OutputFragment::count_lines((OutputFragment *)content.field_2._8_8_);
        b._4_4_ = uVar1 + b._4_4_;
        std::__cxx11::string::~string(local_60);
      }
    }
  }
  return;
}

Assistant:

void OutputFile::emit
	( const std::vector<std::string> & types
	, size_t max_fill
	)
{
	if (file != NULL)
	{
		unsigned int line_count = 1;
		for (unsigned int j = 0; j < blocks.size (); ++j)
		{
			OutputBlock & b = * blocks[j];
			for (unsigned int i = 0; i < b.fragments.size (); ++i)
			{
				OutputFragment & f = * b.fragments[i];
				switch (f.type)
				{
					case OutputFragment::CODE:
						break;
					case OutputFragment::LINE_INFO:
						output_line_info (f.stream, line_count + 1, file_name);
						break;
					case OutputFragment::STATE_GOTO:
						output_state_goto (f.stream, f.indent, 0);
						break;
					case OutputFragment::TYPES:
						output_types (f.stream, f.indent, types);
						break;
					case OutputFragment::WARN_CONDITION_ORDER:
						if (warn_condition_order) // see note [condition order]
						{
							warn.condition_order (b.line);
						}
						break;
					case OutputFragment::YYACCEPT_INIT:
						output_yyaccept_init (f.stream, f.indent, b.used_yyaccept);
						break;
					case OutputFragment::YYMAXFILL:
						output_yymaxfill (f.stream, max_fill);
						break;
				}
				std::string content = f.stream.str ();
				fwrite (content.c_str (), 1, content.size (), file);
				line_count += f.count_lines ();
			}
		}
	}
}